

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatmain.c
# Opt level: O0

void ecx_pusherror(ecx_contextt *context,ec_errort *Ec)

{
  ec_timet *peVar1;
  ec_errort *Ec_local;
  ecx_contextt *context_local;
  
  peVar1 = &context->elist->Error[context->elist->head].Time;
  *peVar1 = Ec->Time;
  peVar1[1] = *(ec_timet *)&Ec->Signal;
  peVar1[2] = *(ec_timet *)&Ec->Etype;
  peVar1[3].sec = *(uint32 *)((long)&Ec->field_6 + 4);
  context->elist->Error[context->elist->head].Signal = '\x01';
  context->elist->head = context->elist->head + 1;
  if (0x40 < context->elist->head) {
    context->elist->head = 0;
  }
  if (context->elist->head == context->elist->tail) {
    context->elist->tail = context->elist->tail + 1;
  }
  if (0x40 < context->elist->tail) {
    context->elist->tail = 0;
  }
  *context->ecaterror = '\x01';
  return;
}

Assistant:

void ecx_pusherror(ecx_contextt *context, const ec_errort *Ec)
{
   context->elist->Error[context->elist->head] = *Ec;
   context->elist->Error[context->elist->head].Signal = TRUE;
   context->elist->head++;
   if (context->elist->head > EC_MAXELIST)
   {
      context->elist->head = 0;
   }
   if (context->elist->head == context->elist->tail)
   {
      context->elist->tail++;
   }
   if (context->elist->tail > EC_MAXELIST)
   {
      context->elist->tail = 0;
   }
   *(context->ecaterror) = TRUE;
}